

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

If_DsdMan_t * If_DsdManAlloc(int nVars,int LutSize)

{
  int iVar1;
  If_DsdMan_t *p_00;
  char *pcVar2;
  uint *puVar3;
  Mem_Flex_t *pMVar4;
  If_DsdObj_t *pIVar5;
  Vec_Int_t *pVVar6;
  word **ppwVar7;
  Vec_Mem_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  int *piVar10;
  void *pvVar11;
  char local_88 [8];
  char pFileName [100];
  int local_1c;
  int v;
  If_DsdMan_t *p;
  int LutSize_local;
  int nVars_local;
  
  if (nVars < 0xd) {
    sprintf(local_88,"%02d.dsd",(ulong)(uint)nVars);
    p_00 = (If_DsdMan_t *)calloc(1,0x2d0);
    pcVar2 = Abc_UtilStrsav(local_88);
    p_00->pStore = pcVar2;
    p_00->nVars = nVars;
    p_00->LutSize = LutSize;
    iVar1 = Abc_TtWordNum(nVars);
    p_00->nWords = iVar1;
    iVar1 = Abc_PrimeCudd(100000);
    p_00->nBins = iVar1;
    puVar3 = (uint *)calloc((long)p_00->nBins,4);
    p_00->pBins = puVar3;
    pMVar4 = Mem_FlexStart();
    p_00->pMem = pMVar4;
    p_00->nConfigWords = 1;
    Vec_PtrGrow(&p_00->vObjs,10000);
    Vec_IntGrow(&p_00->vNexts,10000);
    Vec_IntGrow(&p_00->vTruths,10000);
    If_DsdObjAlloc(p_00,1,0);
    pIVar5 = If_DsdObjAlloc(p_00,2,0);
    *(uint *)&pIVar5->field_0x4 = *(uint *)&pIVar5->field_0x4 & 0xffffff07 | 8;
    pVVar6 = Vec_IntAlloc(0x20);
    p_00->vTemp1 = pVVar6;
    pVVar6 = Vec_IntAlloc(0x20);
    p_00->vTemp2 = pVVar6;
    ppwVar7 = If_ManDsdTtElems();
    p_00->pTtElems = ppwVar7;
    for (local_1c = 3; local_1c <= nVars; local_1c = local_1c + 1) {
      iVar1 = Abc_TtWordNum(local_1c);
      pVVar8 = Vec_MemAlloc(iVar1,0xc);
      p_00->vTtMem[local_1c] = pVVar8;
      Vec_MemHashAlloc(p_00->vTtMem[local_1c],10000);
      pVVar9 = Vec_PtrAlloc(1000);
      p_00->vTtDecs[local_1c] = pVVar9;
    }
    for (local_1c = 2; local_1c < nVars; local_1c = local_1c + 1) {
      piVar10 = Extra_GreyCodeSchedule(local_1c);
      p_00->pSched[local_1c] = piVar10;
    }
    if (LutSize != 0) {
      pvVar11 = If_ManSatBuildXY(LutSize);
      p_00->pSat = pvVar11;
    }
    pVVar6 = Vec_IntAlloc(0);
    p_00->vCover = pVVar6;
    return p_00;
  }
  __assert_fail("nVars <= DAU_MAX_VAR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                ,0x10c,"If_DsdMan_t *If_DsdManAlloc(int, int)");
}

Assistant:

If_DsdMan_t * If_DsdManAlloc( int nVars, int LutSize )
{
    If_DsdMan_t * p; int v;
    char pFileName[100];
    assert( nVars <= DAU_MAX_VAR );
    sprintf( pFileName, "%02d.dsd", nVars );
    p = ABC_CALLOC( If_DsdMan_t, 1 );
    p->pStore  = Abc_UtilStrsav( pFileName );
    p->nVars   = nVars;
    p->LutSize = LutSize;
    p->nWords  = Abc_TtWordNum( nVars );
    p->nBins   = Abc_PrimeCudd( 100000 );
    p->pBins   = ABC_CALLOC( unsigned, p->nBins );
    p->pMem    = Mem_FlexStart();
    p->nConfigWords = 1;
    Vec_PtrGrow( &p->vObjs, 10000 );
    Vec_IntGrow( &p->vNexts, 10000 );
    Vec_IntGrow( &p->vTruths, 10000 );
    If_DsdObjAlloc( p, IF_DSD_CONST0, 0 );
    If_DsdObjAlloc( p, IF_DSD_VAR, 0 )->nSupp = 1;
    p->vTemp1   = Vec_IntAlloc( 32 );
    p->vTemp2   = Vec_IntAlloc( 32 );
    p->pTtElems = If_ManDsdTtElems();
    for ( v = 3; v <= nVars; v++ )
    {
        p->vTtMem[v] = Vec_MemAlloc( Abc_TtWordNum(v), 12 );
        Vec_MemHashAlloc( p->vTtMem[v], 10000 );
        p->vTtDecs[v] = Vec_PtrAlloc( 1000 );
    }
/*
    p->pTtGia   = Gia_ManStart( nVars );
    Gia_ManHashAlloc( p->pTtGia );
    for ( v = 0; v < nVars; v++ )
        Gia_ManAppendCi( p->pTtGia );
*/
    for ( v = 2; v < nVars; v++ )
        p->pSched[v] = Extra_GreyCodeSchedule( v );
    if ( LutSize )
    p->pSat     = If_ManSatBuildXY( LutSize );
    p->vCover   = Vec_IntAlloc( 0 );
    return p;
}